

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyply.h
# Opt level: O0

bool __thiscall tinyply::PlyFile::PlyFileImpl::parse_header(PlyFileImpl *this,istream *is)

{
  bool bVar1;
  istream *piVar2;
  string local_238;
  string local_218;
  int local_1f4;
  undefined1 local_1f0 [8];
  string token;
  istringstream ls;
  bool local_39;
  undefined1 local_38 [7];
  bool success;
  string line;
  istream *is_local;
  PlyFileImpl *this_local;
  
  line.field_2._8_8_ = is;
  std::__cxx11::string::string((string *)local_38);
  local_39 = true;
  do {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)line.field_2._8_8_,(string *)local_38);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::__cxx11::istringstream::istringstream
              ((istringstream *)(token.field_2._M_local_buf + 8),(string *)local_38,_S_in);
    std::__cxx11::string::string((string *)local_1f0);
    std::operator>>((istream *)(token.field_2._M_local_buf + 8),(string *)local_1f0);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1f0,"ply");
    if (((bVar1) ||
        (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1f0,"PLY"), bVar1)) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1f0,""), bVar1)) {
      local_1f4 = 2;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1f0,"comment");
      if (bVar1) {
        std::__cxx11::string::string
                  ((string *)&local_218,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
        read_header_text(this,&local_218,&this->comments,8);
        std::__cxx11::string::~string((string *)&local_218);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1f0,"format");
        if (bVar1) {
          read_header_format(this,(istream *)(token.field_2._M_local_buf + 8));
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1f0,"element");
          if (bVar1) {
            read_header_element(this,(istream *)(token.field_2._M_local_buf + 8));
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_1f0,"property");
            if (bVar1) {
              read_header_property(this,(istream *)(token.field_2._M_local_buf + 8));
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_1f0,"obj_info");
              if (bVar1) {
                std::__cxx11::string::string
                          ((string *)&local_238,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_38);
                read_header_text(this,&local_238,&this->objInfo,9);
                std::__cxx11::string::~string((string *)&local_238);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_1f0,"end_header");
                if (bVar1) {
                  local_1f4 = 3;
                  goto LAB_0012cf20;
                }
                local_39 = false;
              }
            }
          }
        }
      }
      local_1f4 = 0;
    }
LAB_0012cf20:
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::istringstream::~istringstream((istringstream *)(token.field_2._M_local_buf + 8));
  } while ((local_1f4 == 0) || (local_1f4 == 2));
  local_1f4 = 1;
  std::__cxx11::string::~string((string *)local_38);
  return local_39;
}

Assistant:

bool PlyFile::PlyFileImpl::parse_header(std::istream & is)
{
    std::string line;
    bool success = true;
    while (std::getline(is, line))
    {
        std::istringstream ls(line);
        std::string token;
        ls >> token;
        if (token == "ply" || token == "PLY" || token == "") continue;
        else if (token == "comment")    read_header_text(line, comments, 8);
        else if (token == "format")     read_header_format(ls);
        else if (token == "element")    read_header_element(ls);
        else if (token == "property")   read_header_property(ls);
        else if (token == "obj_info")   read_header_text(line, objInfo, 9);
        else if (token == "end_header") break;
        else success = false; // unexpected header field
    }
    return success;
}